

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O1

LPVOID __thiscall
Memory::PreReservedVirtualAllocWrapper::EnsurePreReservedRegion
          (PreReservedVirtualAllocWrapper *this)

{
  LPVOID pvVar1;
  
  pvVar1 = this->preReservedStartAddress;
  if (pvVar1 == (LPVOID)0x0) {
    CCLock::Enter(&(this->cs).super_CCLock);
    pvVar1 = EnsurePreReservedRegionInternal(this);
    CCLock::Leave(&(this->cs).super_CCLock);
  }
  return pvVar1;
}

Assistant:

LPVOID PreReservedVirtualAllocWrapper::EnsurePreReservedRegion()
{
    LPVOID startAddress = preReservedStartAddress;
    if (startAddress != nullptr)
    {
        return startAddress;
    }

    {
        AutoCriticalSection autocs(&this->cs);
        return EnsurePreReservedRegionInternal();
    }
}